

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::CullFaceTestCase::test(CullFaceTestCase *this)

{
  int local_20;
  GLenum GStack_1c;
  int ndx;
  GLenum cullFaces [3];
  CullFaceTestCase *this_local;
  
  cullFaces._4_8_ = this;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb45,
             0x405);
  ApiCase::expectError(&this->super_ApiCase,0);
  _GStack_1c = 0x40500000404;
  cullFaces[0] = 0x408;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    glu::CallLogWrapper::glCullFace
              (&(this->super_ApiCase).super_CallLogWrapper,(&GStack_1c)[local_20]);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb45,
               (ulong)(&GStack_1c)[local_20]);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_CULL_FACE_MODE, GL_BACK);
		expectError(GL_NO_ERROR);

		const GLenum cullFaces[] = {GL_FRONT, GL_BACK, GL_FRONT_AND_BACK};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cullFaces); ndx++)
		{
			glCullFace(cullFaces[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_CULL_FACE_MODE, cullFaces[ndx]);
			expectError(GL_NO_ERROR);
		}
	}